

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TestCaseInfo *other;
  IStreamingReporter *pIVar4;
  SectionTracker *pSVar5;
  IContext *pIVar6;
  byte local_372;
  byte local_362;
  TestCaseStats local_338;
  undefined1 local_198 [8];
  TestCaseInfo testInfo;
  string redirectedCerr;
  string local_68 [8];
  string redirectedCout;
  undefined1 auStack_48 [8];
  Totals prevTotals;
  TestCase *testCase_local;
  RunContext *this_local;
  
  auStack_48 = (undefined1  [8])(this->m_totals).assertions.passed;
  prevTotals.assertions.passed = (this->m_totals).assertions.failed;
  prevTotals.assertions.failed = (this->m_totals).assertions.failedButOk;
  prevTotals.assertions.failedButOk = (this->m_totals).testCases.passed;
  prevTotals.testCases.passed = (this->m_totals).testCases.failed;
  prevTotals.testCases.failed = (this->m_totals).testCases.failedButOk;
  prevTotals.testCases.failedButOk = (size_t)testCase;
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string((string *)&testInfo.properties);
  other = TestCase::getTestCaseInfo((TestCase *)prevTotals.testCases.failedButOk);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_198,other);
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar4,local_198);
  this->m_activeTestCase = (TestCase *)prevTotals.testCases.failedButOk;
  do {
    TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    do {
      TestCaseTracking::TrackerContext::startCycle(&this->m_trackerContext);
      pSVar5 = TestCaseTracking::SectionTracker::acquire
                         (&this->m_trackerContext,(string *)local_198);
      this->m_testCaseTracker = (ITracker *)pSVar5;
      runCurrentTest(this,(string *)local_68,(string *)&testInfo.properties);
      uVar2 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      local_362 = 0;
      if ((uVar2 & 1) == 0) {
        iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])();
        local_362 = (byte)iVar3 ^ 0xff;
      }
    } while ((local_362 & 1) != 0);
    pIVar6 = getCurrentContext();
    uVar2 = (*pIVar6->_vptr_IContext[5])();
    local_372 = 0;
    if ((uVar2 & 1) != 0) {
      iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])();
      local_372 = (byte)iVar3 ^ 0xff;
    }
  } while ((local_372 & 1) != 0);
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)auStack_48);
  bVar1 = TestCaseInfo::expectedToFail((TestCaseInfo *)local_198);
  if ((bVar1) && ((__return_storage_ptr__->testCases).passed != 0)) {
    (__return_storage_ptr__->assertions).failed = (__return_storage_ptr__->assertions).failed + 1;
    (__return_storage_ptr__->testCases).passed = (__return_storage_ptr__->testCases).passed - 1;
    (__return_storage_ptr__->testCases).failed = (__return_storage_ptr__->testCases).failed + 1;
  }
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])();
  TestCaseStats::TestCaseStats
            (&local_338,(TestCaseInfo *)local_198,__return_storage_ptr__,(string *)local_68,
             (string *)&testInfo.properties,(bool)((byte)iVar3 & 1));
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar4,&local_338);
  TestCaseStats::~TestCaseStats(&local_338);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_198);
  std::__cxx11::string::~string((string *)&testInfo.properties);
  std::__cxx11::string::~string(local_68);
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }